

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_base_col_comp_operation<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  *this;
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  *pbVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Column *pCVar7;
  ulong uVar8;
  Column *pCVar9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
  m;
  anon_class_1_0_00000001 local_fc;
  anon_class_1_0_00000001 local_fb;
  anon_class_1_0_00000001 local_fa;
  anon_class_1_0_00000001 local_f9;
  anon_class_8_1_e4bd5e45 local_f8;
  undefined4 local_f0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e8;
  undefined1 local_d0 [80];
  pointer local_80;
  pointer local_60;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  local_d0._0_8_ = operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->list).ptr = (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->requested_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_)->max_size = 0;
  this = (Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
          *)(local_d0 + 8);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
  ::Base_matrix_with_column_compression<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              *)this,&local_e8,(Column_settings *)local_d0._0_8_);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_e8,
             (Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
              *)local_d0);
  uVar2 = local_80[7];
  uVar8 = 7;
  uVar5 = uVar2;
  if (uVar2 != 7) {
    do {
      uVar8 = uVar5;
      uVar5 = local_80[uVar8];
    } while (local_80[uVar8] != uVar8);
  }
  if (uVar8 != uVar2) {
    uVar5 = 7;
    do {
      uVar4 = uVar2;
      local_80[uVar5] = uVar8;
      uVar2 = local_80[uVar4];
      uVar5 = uVar4;
    } while (uVar8 != local_80[uVar4]);
  }
  pbVar1 = (bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
            *)(local_d0 + 0x10);
  pCVar9 = local_60[uVar8 & 0xffffffff];
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  erase<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,std::less<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column>>
            (pbVar1,pCVar9);
  uVar2 = local_80[6];
  uVar4 = 6;
  uVar5 = uVar2;
  if (uVar2 != 6) {
    do {
      uVar4 = uVar5;
      uVar5 = local_80[uVar4];
    } while (local_80[uVar4] != uVar4);
  }
  if (uVar4 != uVar2) {
    uVar5 = 6;
    do {
      uVar6 = uVar2;
      local_80[uVar5] = uVar4;
      uVar2 = local_80[uVar6];
      uVar5 = uVar6;
    } while (uVar4 != local_80[uVar6]);
  }
  pCVar7 = local_60[uVar4 & 0xffffffff];
  if (pCVar7 == (Column *)0x0) {
    pCVar7 = &Gudhi::persistence_matrix::
              Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
              ::empty_column_;
  }
  local_f8.targetColumn = &pCVar9->super_Column;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column>(Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_acces___ess<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,false>___1_>
            (pCVar7,&pCVar9->super_Column,&local_f9,&local_f8,&local_fa,&local_fb,&local_fc);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  ::_insert_column(this,(Index)uVar8);
  local_f8.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
        *)0x300000000;
  local_f0 = 5;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 7),&local_f8);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_e8,
             (Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
              *)local_d0);
  uVar2 = local_80[3];
  uVar8 = 3;
  uVar5 = uVar2;
  if (uVar2 != 3) {
    do {
      uVar8 = uVar5;
      uVar5 = local_80[uVar8];
    } while (local_80[uVar8] != uVar8);
  }
  if (uVar8 != uVar2) {
    uVar5 = 3;
    do {
      uVar4 = uVar2;
      local_80[uVar5] = uVar8;
      uVar2 = local_80[uVar4];
      uVar5 = uVar4;
    } while (uVar8 != local_80[uVar4]);
  }
  pCVar9 = local_60[uVar8 & 0xffffffff];
  if (pCVar9 == (Column *)0x0) {
    pCVar9 = &Gudhi::persistence_matrix::
              Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
              ::empty_column_;
  }
  uVar2 = local_80[10];
  uVar8 = 10;
  uVar5 = uVar2;
  if (uVar2 != 10) {
    do {
      uVar8 = uVar5;
      uVar5 = local_80[uVar8];
    } while (local_80[uVar8] != uVar8);
  }
  if (uVar8 != uVar2) {
    uVar5 = 10;
    do {
      uVar4 = uVar2;
      local_80[uVar5] = uVar8;
      uVar2 = local_80[uVar4];
      uVar5 = uVar4;
    } while (uVar8 != local_80[uVar4]);
  }
  pCVar7 = local_60[uVar8 & 0xffffffff];
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  erase<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,std::less<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column>>
            (pbVar1,pCVar7);
  local_f8.targetColumn = &pCVar7->super_Column;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,fal___ess<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,false>&)_1_>
            (&pCVar9->super_Column,&pCVar7->super_Column,(anon_class_1_0_00000001 *)&local_f9,
             (anon_class_8_1_e4bd5e45 *)&local_f8,(anon_class_1_0_00000001 *)&local_fa,
             (anon_class_1_0_00000001 *)&local_fb,(anon_class_1_0_00000001 *)&local_fc);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  ::_insert_column(this,(Index)uVar8);
  local_f8.targetColumn._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),&local_f8);
  local_f8.targetColumn._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 10),&local_f8);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_e8,
             (Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
              *)local_d0);
  uVar2 = local_80[3];
  uVar8 = 3;
  uVar5 = uVar2;
  if (uVar2 != 3) {
    do {
      uVar8 = uVar5;
      uVar5 = local_80[uVar8];
    } while (local_80[uVar8] != uVar8);
  }
  if (uVar8 != uVar2) {
    uVar5 = 3;
    do {
      uVar4 = uVar2;
      local_80[uVar5] = uVar8;
      uVar2 = local_80[uVar4];
      uVar5 = uVar4;
    } while (uVar8 != local_80[uVar4]);
  }
  pCVar9 = local_60[uVar8 & 0xffffffff];
  if (pCVar9 == (Column *)0x0) {
    pCVar9 = &Gudhi::persistence_matrix::
              Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
              ::empty_column_;
  }
  local_f8.targetColumn._0_1_ = 1;
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
  ::
  multiply_target_and_add_to<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              *)this,&pCVar9->super_Column,(Field_element *)&local_f8,5);
  local_f8.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
        *)0x200000000;
  local_f0 = 4;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),&local_f8);
  local_f8.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
        *)0x200000000;
  local_f0 = 4;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8),&local_f8);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_e8,
             (Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
              *)local_d0);
  uVar2 = local_80[3];
  uVar8 = 3;
  uVar5 = uVar2;
  if (uVar2 != 3) {
    do {
      uVar8 = uVar5;
      uVar5 = local_80[uVar8];
    } while (local_80[uVar8] != uVar8);
  }
  if (uVar8 != uVar2) {
    uVar5 = 3;
    do {
      uVar4 = uVar2;
      local_80[uVar5] = uVar8;
      uVar2 = local_80[uVar4];
      uVar5 = uVar4;
    } while (uVar8 != local_80[uVar4]);
  }
  pCVar9 = &Gudhi::persistence_matrix::
            Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
            ::empty_column_;
  if (local_60[uVar8 & 0xffffffff] != (Column *)0x0) {
    pCVar9 = local_60[uVar8 & 0xffffffff];
  }
  uVar2 = local_80[6];
  uVar8 = 6;
  uVar5 = uVar2;
  if (uVar2 != 6) {
    do {
      uVar8 = uVar5;
      uVar5 = local_80[uVar8];
    } while (local_80[uVar8] != uVar8);
  }
  if (uVar8 != uVar2) {
    uVar5 = 6;
    do {
      uVar4 = uVar2;
      local_80[uVar5] = uVar8;
      uVar2 = local_80[uVar4];
      uVar5 = uVar4;
    } while (uVar8 != local_80[uVar4]);
  }
  pCVar7 = local_60[uVar8 & 0xffffffff];
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  erase<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column,std::less<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column>>
            (pbVar1,pCVar7);
  local_f8.targetColumn = &pCVar7->super_Column;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,fal___ess<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,false>&)_1_>
            (&pCVar9->super_Column,&pCVar7->super_Column,(anon_class_1_0_00000001 *)&local_f9,
             (anon_class_8_1_e4bd5e45 *)&local_f8,(anon_class_1_0_00000001 *)&local_fa,
             (anon_class_1_0_00000001 *)&local_fb,(anon_class_1_0_00000001 *)&local_fc);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  ::_insert_column(this,(Index)uVar8);
  local_f8.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
        *)0x400000000;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),&local_f8);
  local_f8.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
        *)0x400000000;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_e8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 10),&local_f8);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_e8,
             (Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
              *)local_d0);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  ::reset(this,(Column_settings *)local_d0._0_8_);
  uVar3 = local_d0._0_8_;
  if ((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_ !=
      (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)local_d0._0_8_);
  }
  operator_delete((void *)uVar3,0x38);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  ::~Base_matrix_with_column_compression(this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

void test_base_col_comp_operation() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.add_to(6, 7);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[7] = {0, 3, 5};
  } else {
    columns[7] = {{0, 1}, {3, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.add_to(m.get_column(3), 10);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
    columns[10] = {1};
  } else {
    columns[6] = {{0, 2}, {1, 4}};
    columns[10] = {{0, 2}, {1, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_target_and_add_to(m.get_column(3), 3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
    columns[8] = {0, 2, 4};
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
    columns[8] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(3, m.get_column(3), 6);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {0, 4};
    columns[10] = {0, 4};
  } else {
    columns[6] = {{1, 1}, {4, 3}};
    columns[10] = {{1, 1}, {4, 3}};
  }
  test_content_equality(columns, m);
}